

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<void_(const_int_&)> * __thiscall
testing::internal::TypedExpectation<void_(const_int_&)>::Times
          (TypedExpectation<void_(const_int_&)> *this,int n)

{
  TypedExpectation<void_(const_int_&)> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<void_(const_int_&)> *pTStack_10;
  int n_local;
  TypedExpectation<void_(const_int_&)> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }